

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:549:62)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:549:62)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<capnp::MessageReaderAndFds> *pEVar1;
  Maybe<capnp::MessageReaderAndFds> *t;
  Type *func;
  MessageReaderAndFds local_5b0;
  ExceptionOr<capnp::MessageReaderAndFds> local_590;
  Maybe<capnp::MessageReaderAndFds> *local_3d0;
  Maybe<capnp::MessageReaderAndFds> *depValue;
  Maybe<capnp::MessageReaderAndFds> *_depValue779;
  Exception *local_200;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1e0 [8];
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:549:62)>
  *this_local;
  
  depResult.value.ptr.field_1._32_8_ = output;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::ExceptionOr
            ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)local_1e0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1e0);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1e0);
  if (depException == (Exception *)0x0) {
    t = readMaybe<kj::Maybe<capnp::MessageReaderAndFds>>
                  ((Maybe<kj::Maybe<capnp::MessageReaderAndFds>_> *)
                   ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.
                           builder + 0x18));
    depValue = t;
    if (t != (Maybe<capnp::MessageReaderAndFds> *)0x0) {
      local_3d0 = t;
      func = (Type *)mv<kj::Maybe<capnp::MessageReaderAndFds>>(t);
      MaybeVoidCaller<kj::Maybe<capnp::MessageReaderAndFds>,capnp::MessageReaderAndFds>::
      apply<capnp::MessageStream::readMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
                (&local_5b0,
                 (MaybeVoidCaller<kj::Maybe<capnp::MessageReaderAndFds>,capnp::MessageReaderAndFds>
                  *)&this->field_0x20,func,t);
      TransformPromiseNodeBase::handle<capnp::MessageReaderAndFds>
                (&local_590,&this->super_TransformPromiseNodeBase,&local_5b0);
      pEVar1 = ExceptionOrValue::as<capnp::MessageReaderAndFds>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
      ExceptionOr<capnp::MessageReaderAndFds>::operator=(pEVar1,&local_590);
      ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr(&local_590);
      ::capnp::MessageReaderAndFds::~MessageReaderAndFds(&local_5b0);
    }
  }
  else {
    local_200 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<capnp::MessageReaderAndFds>::ExceptionOr
              ((ExceptionOr<capnp::MessageReaderAndFds> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<capnp::MessageReaderAndFds>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              (pEVar1,(ExceptionOr<capnp::MessageReaderAndFds> *)&_depValue779);
    ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr
              ((ExceptionOr<capnp::MessageReaderAndFds> *)&_depValue779);
  }
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr
            ((ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> *)local_1e0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }